

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

void Gia_ManFindUnatePairsInt
               (word *pOff,word *pOn,Vec_Int_t *vBinate,Vec_Ptr_t *vDivs,int nWords,
               Vec_Int_t *vUnatePairs)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  
  iVar1 = vBinate->nSize;
  if (0 < (long)iVar1) {
    uVar12 = (ulong)(uint)nWords;
    lVar10 = 0;
    do {
      if (vBinate->nSize <= lVar10) {
LAB_00793b7d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (lVar10 != 0) {
        uVar2 = vBinate->pArray[lVar10];
        lVar11 = 0;
LAB_007938fb:
        if (lVar11 < vBinate->nSize) {
          uVar3 = vBinate->pArray[lVar11];
          uVar6 = uVar2;
          if ((int)uVar3 < (int)uVar2) {
            uVar6 = uVar3;
          }
          if ((int)uVar3 <= (int)uVar2) {
            uVar3 = uVar2;
          }
          if (((((int)uVar6 < 0) || (vDivs->nSize <= (int)uVar6)) || ((int)uVar3 < 0)) ||
             (vDivs->nSize <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar4 = vDivs->pArray[uVar6];
          pvVar5 = vDivs->pArray[uVar3];
          uVar9 = 0;
LAB_00793976:
          bVar7 = (byte)uVar9 & 1 < uVar9;
          if (bVar7 == 1) {
            if (0 < nWords) {
              uVar8 = 0;
              do {
                if ((pOff[uVar8] &
                    ~(*(ulong *)((long)pvVar4 + uVar8 * 8) | *(ulong *)((long)pvVar5 + uVar8 * 8)))
                    != 0) goto LAB_00793af7;
                uVar8 = uVar8 + 1;
              } while (uVar12 != uVar8);
            }
          }
          else if (uVar9 < 2) {
            if ((uVar9 & 1) == 0) {
              if (0 < nWords) {
                uVar8 = 0;
                do {
                  if ((pOff[uVar8] &
                      *(ulong *)((long)pvVar4 + uVar8 * 8) & *(ulong *)((long)pvVar5 + uVar8 * 8))
                      != 0) goto LAB_00793af7;
                  uVar8 = uVar8 + 1;
                } while (uVar12 != uVar8);
              }
            }
            else if (0 < nWords) {
              uVar8 = 0;
              do {
                if ((pOff[uVar8] &
                    ~*(ulong *)((long)pvVar4 + uVar8 * 8) & *(ulong *)((long)pvVar5 + uVar8 * 8)) !=
                    0) goto LAB_00793af7;
                uVar8 = uVar8 + 1;
              } while (uVar12 != uVar8);
            }
          }
          else if (0 < nWords) {
            uVar8 = 0;
            do {
              if ((pOff[uVar8] &
                  ~*(ulong *)((long)pvVar5 + uVar8 * 8) & *(ulong *)((long)pvVar4 + uVar8 * 8)) != 0
                 ) goto LAB_00793af7;
              uVar8 = uVar8 + 1;
            } while (uVar12 != uVar8);
          }
          if (bVar7 == 0) {
            if (uVar9 < 2) {
              if ((uVar9 & 1) == 0) {
                if (0 < nWords) {
                  uVar8 = 0;
                  do {
                    if ((pOn[uVar8] &
                        *(ulong *)((long)pvVar4 + uVar8 * 8) & *(ulong *)((long)pvVar5 + uVar8 * 8))
                        != 0) goto LAB_00793aca;
                    uVar8 = uVar8 + 1;
                  } while (uVar12 != uVar8);
                }
              }
              else if (0 < nWords) {
                uVar8 = 0;
                do {
                  if ((pOn[uVar8] &
                      ~*(ulong *)((long)pvVar4 + uVar8 * 8) & *(ulong *)((long)pvVar5 + uVar8 * 8))
                      != 0) goto LAB_00793aca;
                  uVar8 = uVar8 + 1;
                } while (uVar12 != uVar8);
              }
            }
            else if (0 < nWords) {
              uVar8 = 0;
              do {
                if ((pOn[uVar8] &
                    ~*(ulong *)((long)pvVar5 + uVar8 * 8) & *(ulong *)((long)pvVar4 + uVar8 * 8)) !=
                    0) goto LAB_00793aca;
                uVar8 = uVar8 + 1;
              } while (uVar12 != uVar8);
            }
          }
          else if (0 < nWords) {
            uVar8 = 0;
            do {
              if ((pOn[uVar8] &
                  ~(*(ulong *)((long)pvVar4 + uVar8 * 8) | *(ulong *)((long)pvVar5 + uVar8 * 8))) !=
                  0) goto LAB_00793aca;
              uVar8 = uVar8 + 1;
            } while (uVar12 != uVar8);
          }
          goto LAB_00793af7;
        }
        goto LAB_00793b7d;
      }
LAB_00793b22:
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar1);
  }
  return;
LAB_00793aca:
  if ((int)(uVar3 << 0x10) < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  Vec_IntPush(vUnatePairs,(uVar9 & 1 | uVar6 * 2 | uVar3 << 0x10 | (uVar9 & 2) << 0xe) * 2);
LAB_00793af7:
  uVar9 = uVar9 + 1;
  if (uVar9 == 4) goto code_r0x00793b02;
  goto LAB_00793976;
code_r0x00793b02:
  lVar11 = lVar11 + 1;
  if (lVar11 == lVar10) goto LAB_00793b22;
  goto LAB_007938fb;
}

Assistant:

void Gia_ManFindUnatePairsInt( word * pOff, word * pOn, Vec_Int_t * vBinate, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs )
{
    int n, i, k, iDiv0_, iDiv1_;
    int Limit2 = Vec_IntSize(vBinate);//Abc_MinInt( Vec_IntSize(vBinate), 100 );
    Vec_IntForEachEntryStop( vBinate, iDiv1_, i, Limit2 )
    Vec_IntForEachEntryStop( vBinate, iDiv0_, k, i )
    {
        int iDiv0 = Abc_MinInt( iDiv0_, iDiv1_ );
        int iDiv1 = Abc_MaxInt( iDiv0_, iDiv1_ );
        word * pDiv0 = (word *)Vec_PtrEntry(vDivs, iDiv0);
        word * pDiv1 = (word *)Vec_PtrEntry(vDivs, iDiv1);
        for ( n = 0; n < 4; n++ )
        {
            int iLit0 = Abc_Var2Lit( iDiv0, n&1 );
            int iLit1 = Abc_Var2Lit( iDiv1, n>>1 );
            //if ( !Abc_TtIntersectTwo( pOff, 0, pDiv1, n>>1, pDiv0, n&1, nWords ) )
            if ( !Abc_TtIntersectTwo( pOff, 0, pDiv1, n>>1, pDiv0, n&1, nWords ) && Abc_TtIntersectTwo( pOn, 0, pDiv1, n>>1, pDiv0, n&1, nWords ) )
                Vec_IntPush( vUnatePairs, Abc_Var2Lit((iLit1 << 15) | iLit0, 0) );
        }
    }
}